

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listReporters(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  unsigned_long *puVar5;
  element_type *peVar6;
  Column *this;
  size_type sVar7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>
  *factoryKvp_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  FactoryMap *__range1_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>
  *factoryKvp;
  const_iterator __end1;
  const_iterator __begin1;
  FactoryMap *__range1;
  size_t maxNameLen;
  FactoryMap *factories;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
  *in_stack_fffffffffffffe98;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>
  *in_stack_fffffffffffffea0;
  Column *in_stack_fffffffffffffea8;
  Column *in_stack_fffffffffffffeb0;
  Column *in_stack_fffffffffffffec0;
  Column *in_stack_fffffffffffffec8;
  string local_120 [72];
  Columns *in_stack_ffffffffffffff28;
  ostream *in_stack_ffffffffffffff30;
  string local_c0 [32];
  Column local_a0;
  reference local_58;
  _Self local_50;
  _Self local_48;
  undefined8 local_40;
  unsigned_long local_38;
  reference local_30;
  _Self local_28;
  _Self local_20;
  undefined8 local_18;
  unsigned_long local_10;
  undefined8 local_8;
  
  poVar3 = cout();
  std::operator<<(poVar3,"Available reporters:\n");
  pIVar4 = getRegistryHub();
  iVar2 = (*pIVar4->_vptr_IRegistryHub[2])();
  local_18 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))();
  local_10 = 0;
  local_8 = local_18;
  local_20._M_node =
       (_Base_ptr)
       clara::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
       ::begin(in_stack_fffffffffffffe98);
  local_28._M_node =
       (_Base_ptr)
       clara::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
       ::end(in_stack_fffffffffffffe98);
  while( true ) {
    bVar1 = clara::std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    local_30 = clara::std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>
                            *)0x252488);
    local_38 = std::__cxx11::string::size();
    puVar5 = clara::std::max<unsigned_long>(&local_10,&local_38);
    local_10 = *puVar5;
    clara::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>
    ::operator++(in_stack_fffffffffffffea0);
  }
  local_40 = local_8;
  local_48._M_node =
       (_Base_ptr)
       clara::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
       ::begin(in_stack_fffffffffffffe98);
  local_50._M_node =
       (_Base_ptr)
       clara::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
       ::end(in_stack_fffffffffffffe98);
  while( true ) {
    bVar1 = clara::std::operator!=(&local_48,&local_50);
    if (!bVar1) break;
    local_58 = clara::std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>
                            *)0x252539);
    cout();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
    clara::TextFlow::Column::Column(in_stack_fffffffffffffeb0,(string *)in_stack_fffffffffffffea8);
    in_stack_fffffffffffffec8 = clara::TextFlow::Column::indent(&local_a0,2);
    in_stack_fffffffffffffec0 =
         clara::TextFlow::Column::width(in_stack_fffffffffffffec8,local_10 + 5);
    peVar6 = clara::std::
             __shared_ptr_access<Catch::IReporterFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Catch::IReporterFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2525c7);
    (*peVar6->_vptr_IReporterFactory[3])(local_120);
    clara::TextFlow::Column::Column(in_stack_fffffffffffffeb0,(string *)in_stack_fffffffffffffea8);
    this = clara::TextFlow::Column::initialIndent((Column *)(local_120 + 0x20),0);
    in_stack_fffffffffffffeb0 = clara::TextFlow::Column::indent(this,2);
    in_stack_fffffffffffffea8 =
         clara::TextFlow::Column::width(in_stack_fffffffffffffeb0,0x48 - local_10);
    clara::TextFlow::Column::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    poVar3 = clara::TextFlow::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::operator<<(poVar3,"\n");
    clara::TextFlow::Columns::~Columns((Columns *)0x252689);
    clara::TextFlow::Column::~Column((Column *)0x252693);
    std::__cxx11::string::~string(local_120);
    clara::TextFlow::Column::~Column((Column *)0x2526aa);
    std::__cxx11::string::~string(local_c0);
    clara::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>
                  *)poVar3);
  }
  poVar3 = cout();
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  sVar7 = clara::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
                  *)0x252796);
  return sVar7;
}

Assistant:

std::size_t listReporters() {
        Catch::cout() << "Available reporters:\n";
        IReporterRegistry::FactoryMap const& factories = getRegistryHub().getReporterRegistry().getFactories();
        std::size_t maxNameLen = 0;
        for( auto const& factoryKvp : factories )
            maxNameLen = (std::max)( maxNameLen, factoryKvp.first.size() );

        for( auto const& factoryKvp : factories ) {
            Catch::cout()
                    << Column( factoryKvp.first + ":" )
                            .indent(2)
                            .width( 5+maxNameLen )
                    +  Column( factoryKvp.second->getDescription() )
                            .initialIndent(0)
                            .indent(2)
                            .width( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen-8 )
                    << "\n";
        }
        Catch::cout() << std::endl;
        return factories.size();
    }